

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

int bundle_remove_conn(connectbundle *bundle,connectdata *conn)

{
  Curl_llist_element *e;
  int in_EAX;
  int extraout_EAX;
  Curl_llist *pCVar1;
  
  pCVar1 = &bundle->conn_list;
  while( true ) {
    e = pCVar1->head;
    if (e == (Curl_llist_element *)0x0) {
      return in_EAX;
    }
    if ((connectdata *)e->ptr == conn) break;
    pCVar1 = (Curl_llist *)&e->next;
  }
  Curl_llist_remove(&bundle->conn_list,e,(void *)0x0);
  bundle->num_connections = bundle->num_connections - 1;
  conn->bundle = (connectbundle *)0x0;
  return extraout_EAX;
}

Assistant:

static int bundle_remove_conn(struct connectbundle *bundle,
                              struct connectdata *conn)
{
  struct Curl_llist_element *curr;

  curr = bundle->conn_list.head;
  while(curr) {
    if(curr->ptr == conn) {
      Curl_llist_remove(&bundle->conn_list, curr, NULL);
      bundle->num_connections--;
      conn->bundle = NULL;
      return 1; /* we removed a handle */
    }
    curr = curr->next;
  }
  DEBUGASSERT(0);
  return 0;
}